

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O2

UBool icu_63::matches16CPB(UChar *s,int32_t start,int32_t limit,UChar *t,int32_t length)

{
  UChar *pUVar1;
  UBool UVar2;
  int iVar3;
  long lVar4;
  
  pUVar1 = s + start;
  iVar3 = length + 1;
  lVar4 = 0;
  do {
    if (*(short *)((long)pUVar1 + lVar4) != *(short *)((long)t + lVar4)) goto LAB_002ac4fd;
    lVar4 = lVar4 + 2;
    iVar3 = iVar3 + -1;
  } while (1 < iVar3);
  if (((start < 1) || ((pUVar1[-1] & 0xfc00U) != 0xd800)) || ((*pUVar1 & 0xfc00U) != 0xdc00)) {
    UVar2 = '\x01';
    if ((length < limit - start) && ((pUVar1[(long)length + -1] & 0xfc00U) == 0xd800)) {
      return (pUVar1[length] & 0xfc00U) != 0xdc00;
    }
  }
  else {
LAB_002ac4fd:
    UVar2 = '\0';
  }
  return UVar2;
}

Assistant:

static inline UBool
matches16CPB(const UChar *s, int32_t start, int32_t limit, const UChar *t, int32_t length) {
    s+=start;
    limit-=start;
    return matches16(s, t, length) &&
           !(0<start && U16_IS_LEAD(s[-1]) && U16_IS_TRAIL(s[0])) &&
           !(length<limit && U16_IS_LEAD(s[length-1]) && U16_IS_TRAIL(s[length]));
}